

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

BlockInformationStruct * __thiscall
cfd::js::api::json::BlockInformation::ConvertToStruct
          (BlockInformationStruct *__return_storage_ptr__,BlockInformation *this)

{
  uint32_t uVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  BlockInformationStruct::BlockInformationStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct(&local_30,&this->tx_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&__return_storage_ptr__->tx,&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  __return_storage_ptr__->version = this->version_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->version_hex);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->previousblockhash);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->merkleroot);
  uVar1 = this->bits_;
  __return_storage_ptr__->time = this->time_;
  __return_storage_ptr__->bits = uVar1;
  __return_storage_ptr__->nonce = this->nonce_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

BlockInformationStruct BlockInformation::ConvertToStruct() const {  // NOLINT
  BlockInformationStruct result;
  result.block_hash = block_hash_;
  result.tx = tx_.ConvertToStruct();
  result.version = version_;
  result.version_hex = version_hex_;
  result.previousblockhash = previousblockhash_;
  result.merkleroot = merkleroot_;
  result.time = time_;
  result.bits = bits_;
  result.nonce = nonce_;
  result.ignore_items = ignore_items;
  return result;
}